

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void menu(bool *bots,bool *player1,bool *player2)

{
  bool bVar1;
  ostream *poVar2;
  string num;
  allocator<char> local_61;
  bool *local_60;
  bool *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_60 = player1;
  local_58 = player2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"0",&local_61);
LAB_00103561:
  bVar1 = std::operator!=(&local_50,"1");
  if ((((!bVar1) || (bVar1 = std::operator!=(&local_50,"2"), !bVar1)) ||
      (bVar1 = std::operator!=(&local_50,"3"), !bVar1)) ||
     (bVar1 = std::operator!=(&local_50,"4"), !bVar1)) {
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  system("clear");
  poVar2 = std::operator<<((ostream *)&std::cout,"********(");
  poVar2 = std::operator<<(poVar2,"MENU");
  poVar2 = std::operator<<(poVar2,")********");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"1.alone bots");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"2.one player by bots");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"3.two player");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"4.two player by bots");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"**********************");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"Select the number you want : ");
  std::operator>>((istream *)&std::cin,(string *)&local_50);
  bVar1 = std::operator==(&local_50,"1");
  if (((bVar1) || (bVar1 = std::operator==(&local_50,"2"), bVar1)) ||
     (bVar1 = std::operator==(&local_50,"4"), bVar1)) goto LAB_001036b0;
  *local_60 = true;
  goto LAB_001036f7;
LAB_001036b0:
  *bots = true;
  bVar1 = std::operator==(&local_50,"2");
  if ((bVar1) || (bVar1 = std::operator==(&local_50,"4"), bVar1)) {
    *local_60 = true;
  }
  bVar1 = std::operator==(&local_50,"4");
  if (bVar1) {
LAB_001036f7:
    *local_58 = true;
  }
  goto LAB_00103561;
}

Assistant:

void menu(bool& bots, bool& player1, bool& player2)
{
    string num = "0"; 
    while(num != "1" and num != "2" and num != "3" and num != "4") 
    { 
        system("clear"); 
        cout << "********(" << "MENU" << ")********" << endl; 
        cout << "1.alone bots" << endl; 
        cout << "2.one player by bots" << endl; 
        cout << "3.two player" << endl; 
        cout << "4.two player by bots" << endl; 
        cout << "**********************" << endl; 
        cout << "Select the number you want : "; 

        cin >> num; 

		if(num == "1" or num == "2" or num == "4")
		{
			bots = true;
			if(num == "2" or num == "4")
				player1 = true;
			if(num == "4")
				player2 = true;
		}
		else
		{
			player1 = true;	
			player2 = true;
		}
	}
}